

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCheckFile.cpp
# Opt level: O1

uint64_t Imf_3_2::anon_unknown_0::memstream_read
                   (exr_const_context_t f,void *userdata,void *buffer,uint64_t sz,uint64_t offset,
                   exr_stream_error_func_ptr_t errcb)

{
  ulong uVar1;
  uint64_t uVar2;
  uint64_t __n;
  
  if (userdata != (void *)0x0) {
    uVar1 = *(ulong *)((long)userdata + 8);
    uVar2 = uVar1 - offset;
    if (uVar1 < offset) {
      uVar2 = 0;
    }
    __n = sz;
    if (uVar1 < sz) {
      __n = uVar2;
    }
    if (uVar1 < offset) {
      __n = uVar2;
    }
    if (uVar1 < sz + offset) {
      __n = uVar2;
    }
    uVar2 = 0;
    if (0 < (long)__n) {
      memcpy(buffer,(void *)(offset + *userdata),__n);
      uVar2 = __n;
    }
    return uVar2;
  }
  return 0;
}

Assistant:

static uint64_t
memstream_read (
    exr_const_context_t         f,
    void*                       userdata,
    void*                       buffer,
    uint64_t                    sz,
    uint64_t                    offset,
    exr_stream_error_func_ptr_t errcb)
{
    int64_t rdsz = 0;
    if (userdata)
    {
        memdata* md   = static_cast<memdata*> (userdata);
        int64_t left = sz;
        if (offset > md->bytes ||  sz > md->bytes || offset+sz > md->bytes)
            left = (offset < md->bytes) ? md->bytes - offset : 0;
        if (left > 0)
        {
            memcpy (buffer, md->data + offset, left);
            rdsz = left;
        }
    }

    return rdsz;
}